

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_c.cpp
# Opt level: O0

void spvc_msl_sampler_ycbcr_conversion_init(spvc_msl_sampler_ycbcr_conversion *conv)

{
  int local_78;
  undefined1 local_74 [4];
  int i;
  MSLConstexprSampler defaults;
  spvc_msl_sampler_ycbcr_conversion *conv_local;
  
  defaults._92_8_ = conv;
  spirv_cross::MSLConstexprSampler::MSLConstexprSampler((MSLConstexprSampler *)local_74);
  *(float *)defaults._92_8_ = defaults.lod_clamp_max;
  *(int *)(defaults._92_8_ + 4) = defaults.max_anisotropy;
  *(uint32_t *)(defaults._92_8_ + 8) = defaults.planes;
  *(MSLFormatResolution *)(defaults._92_8_ + 0xc) = defaults.resolution;
  *(MSLSamplerFilter *)(defaults._92_8_ + 0x10) = defaults.chroma_filter;
  for (local_78 = 0; local_78 < 4; local_78 = local_78 + 1) {
    *(MSLComponentSwizzle *)(defaults._92_8_ + 0x14 + (long)local_78 * 4) =
         defaults.swizzle[(long)local_78 + -2];
  }
  *(MSLComponentSwizzle *)(defaults._92_8_ + 0x24) = defaults.swizzle[2];
  *(MSLComponentSwizzle *)(defaults._92_8_ + 0x28) = defaults.swizzle[3];
  return;
}

Assistant:

void spvc_msl_sampler_ycbcr_conversion_init(spvc_msl_sampler_ycbcr_conversion *conv)
{
#if SPIRV_CROSS_C_API_MSL
	MSLConstexprSampler defaults;
	conv->planes = defaults.planes;
	conv->resolution = static_cast<spvc_msl_format_resolution>(defaults.resolution);
	conv->chroma_filter = static_cast<spvc_msl_sampler_filter>(defaults.chroma_filter);
	conv->x_chroma_offset = static_cast<spvc_msl_chroma_location>(defaults.x_chroma_offset);
	conv->y_chroma_offset = static_cast<spvc_msl_chroma_location>(defaults.y_chroma_offset);
	for (int i = 0; i < 4; i++)
		conv->swizzle[i] = static_cast<spvc_msl_component_swizzle>(defaults.swizzle[i]);
	conv->ycbcr_model = static_cast<spvc_msl_sampler_ycbcr_model_conversion>(defaults.ycbcr_model);
	conv->ycbcr_range = static_cast<spvc_msl_sampler_ycbcr_range>(defaults.ycbcr_range);
#else
	memset(conv, 0, sizeof(*conv));
#endif
}